

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void dpfb::args::printHelp(char *progName)

{
  char *progName_local;
  
  printf(help,dpfbVersion,progName,codePoints,(ulong)fontDpi,fontExportFormat,fontSize,fontRenderer,
         hinting,imageFormat,imageMaxCount,imageMaxSize,imageSizeMode);
  printf("Font export formats (-font-export-format):\n");
  listPlugins<dpfb::FontWriter>();
  printf("Font renderers (-font-renderer):\n");
  listPlugins<dpfb::FontRendererCreator>();
  printf("Image formats (-image-format):\n");
  listPlugins<dpfb::ImageWriter>();
  return;
}

Assistant:

static void printHelp(const char* progName)
{
    std::printf(
        help,
        dpfbVersion,
        progName,
        codePoints,
        fontDpi, fontExportFormat, fontSize, fontRenderer,
        hinting,
        imageFormat,
        imageMaxCount, imageMaxSize, imageSizeMode);

    std::printf("Font export formats (-font-export-format):\n");
    listPlugins<FontWriter>();

    std::printf("Font renderers (-font-renderer):\n");
    listPlugins<FontRendererCreator>();

    std::printf("Image formats (-image-format):\n");
    listPlugins<ImageWriter>();
}